

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
cpptrace::detail::optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>
::swap(optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *this,
      optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *other)

{
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *other_local;
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *this_local;
  
  if (((this->holds_value & 1U) == 0) || ((other->holds_value & 1U) == 0)) {
    if (((this->holds_value & 1U) == 0) || ((other->holds_value & 1U) != 0)) {
      if (((this->holds_value & 1U) == 0) && ((other->holds_value & 1U) != 0)) {
        this->field_0 = other->field_0;
      }
    }
    else {
      other->field_0 = this->field_0;
    }
  }
  else {
    std::swap<std::reference_wrapper<cpptrace::detail::libdwarf::die_object_const>>
              ((reference_wrapper<const_cpptrace::detail::libdwarf::die_object> *)this,
               (reference_wrapper<const_cpptrace::detail::libdwarf::die_object> *)other);
  }
  std::swap<bool>(&this->holds_value,&other->holds_value);
  return;
}

Assistant:

void swap(optional& other) noexcept {
            if(holds_value && other.holds_value) {
                std::swap(uvalue, other.uvalue);
            } else if(holds_value && !other.holds_value) {
                new (&other.uvalue) T(std::move(uvalue));
                uvalue.~T();
            } else if(!holds_value && other.holds_value) {
                new (static_cast<void*>(std::addressof(uvalue))) T(std::move(other.uvalue));
                other.uvalue.~T();
            }
            std::swap(holds_value, other.holds_value);
        }